

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

void __thiscall
bgui::ImageAdapter<unsigned_char>::adaptMinMaxIntensity
          (ImageAdapter<unsigned_char> *this,long x,long y,long w,long h)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar5;
  uchar *puVar6;
  undefined1 auVar7 [16];
  double dVar8;
  ulong uVar9;
  SMatrix<long,_2,_3> *pSVar10;
  long lVar11;
  int i;
  long lVar12;
  int iVar13;
  SMatrix<long,_2,_3> *pSVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long local_70 [8];
  SVector<long,_2> p2;
  SVector<long,_2> p1;
  
  dVar1 = (this->super_ImageAdapterBase).scale;
  pSVar10 = &(this->super_ImageAdapterBase).R;
  local_70[0] = (long)((double)x / dVar1);
  local_70[1] = (long)((double)y / dVar1);
  local_70[2] = 1;
  local_70[5] = 0;
  local_70[6] = 0;
  pSVar14 = pSVar10;
  lVar11 = 0;
  do {
    lVar16 = local_70[lVar11 + 5];
    lVar12 = 0;
    do {
      lVar16 = lVar16 + local_70[lVar12] * pSVar14->v[0][lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_70[lVar11 + 5] = lVar16;
    pSVar14 = (SMatrix<long,_2,_3> *)(pSVar14->v + 1);
    bVar19 = lVar11 == 0;
    lVar11 = lVar11 + 1;
  } while (bVar19);
  local_70[0] = (long)((double)(w + x + -1) / dVar1);
  local_70[1] = (long)((double)(y + -1 + h) / dVar1);
  local_70[2] = 1;
  local_70[3] = 0;
  local_70[4] = 0;
  lVar11 = 0;
  do {
    lVar16 = local_70[lVar11 + 3];
    lVar12 = 0;
    do {
      lVar16 = lVar16 + local_70[lVar12] * pSVar10->v[0][lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_70[lVar11 + 3] = lVar16;
    pSVar10 = (SMatrix<long,_2,_3> *)(pSVar10->v + 1);
    bVar19 = lVar11 == 0;
    lVar11 = lVar11 + 1;
  } while (bVar19);
  lVar11 = local_70[5];
  if (local_70[3] < local_70[5]) {
    lVar11 = local_70[3];
  }
  lVar16 = local_70[6];
  if (local_70[4] < local_70[6]) {
    lVar16 = local_70[4];
  }
  if (lVar11 < 1) {
    lVar11 = 0;
  }
  pIVar5 = this->image;
  lVar12 = pIVar5->width;
  lVar17 = pIVar5->height;
  if (lVar16 < 1) {
    lVar16 = 0;
  }
  dVar1 = this->vmax;
  (this->super_ImageAdapterBase).imin = dVar1;
  dVar2 = this->vmin;
  (this->super_ImageAdapterBase).imax = dVar2;
  iVar3 = pIVar5->depth;
  iVar4 = (this->super_ImageAdapterBase).channel;
  iVar15 = 0;
  if (-1 < iVar4 && iVar4 < iVar3) {
    iVar15 = iVar4;
  }
  iVar13 = iVar3 + -1;
  if (-1 < iVar4 && iVar4 < iVar3) {
    iVar13 = iVar4;
  }
  if (iVar15 <= iVar13) {
    lVar17 = lVar17 + -1;
    if (local_70[4] < local_70[6]) {
      local_70[4] = local_70[6];
    }
    if (lVar17 < local_70[4]) {
      local_70[4] = lVar17;
    }
    lVar12 = lVar12 + -1;
    if (local_70[3] < local_70[5]) {
      local_70[3] = local_70[5];
    }
    if (lVar12 < local_70[3]) {
      local_70[3] = lVar12;
    }
    lVar12 = (long)iVar15;
    dVar20 = (this->super_ImageAdapterBase).imin;
    dVar21 = (this->super_ImageAdapterBase).imax;
    do {
      lVar17 = lVar16;
      dVar22 = dVar20;
      dVar23 = dVar21;
      if (lVar16 <= local_70[4]) {
        do {
          if (local_70[3] < lVar11) {
            auVar25._8_8_ = dVar21;
            auVar25._0_8_ = dVar20;
          }
          else {
            puVar6 = pIVar5->img[lVar12][lVar17];
            auVar25._8_8_ = dVar21;
            auVar25._0_8_ = dVar20;
            lVar18 = lVar11;
            do {
              dVar8 = (double)puVar6[lVar18];
              if ((dVar2 <= dVar8) && (dVar8 <= dVar1)) {
                uVar9 = (ulong)dVar8 & -(ulong)(dVar21 < dVar8);
                auVar24._0_8_ = ~-(ulong)(dVar8 < dVar20) & (ulong)dVar20;
                auVar24._8_8_ = ~-(ulong)(dVar21 < dVar8) & (ulong)dVar21;
                auVar7._8_4_ = (int)uVar9;
                auVar7._0_8_ = (ulong)dVar8 & -(ulong)(dVar8 < dVar20);
                auVar7._12_4_ = (int)(uVar9 >> 0x20);
                auVar25 = auVar24 | auVar7;
                (this->super_ImageAdapterBase).imin = (double)auVar25._0_8_;
                (this->super_ImageAdapterBase).imax = (double)auVar25._8_8_;
                dVar20 = auVar25._0_8_;
                dVar21 = auVar25._8_8_;
                dVar22 = dVar20;
                dVar23 = dVar21;
              }
              lVar18 = lVar18 + 1;
            } while (local_70[3] + 1 != lVar18);
          }
          dVar20 = auVar25._0_8_;
          dVar21 = auVar25._8_8_;
          bVar19 = lVar17 != local_70[4];
          lVar17 = lVar17 + 1;
        } while (bVar19);
      }
      lVar12 = lVar12 + 1;
      dVar20 = dVar22;
      dVar21 = dVar23;
    } while (iVar13 + 1 != (int)lVar12);
  }
  if ((this->super_ImageAdapterBase).imax <= (this->super_ImageAdapterBase).imin) {
    (this->super_ImageAdapterBase).imin = 0.0;
    (this->super_ImageAdapterBase).imax = 1.0;
  }
  return;
}

Assistant:

void adaptMinMaxIntensity(long x, long y, long w, long h)
    {
      // compute original area

      const gmath::SVector<long, 2> p1=R*gmath::SVector<long, 3>(static_cast<long>(x/scale),
                                       static_cast<long>(y/scale), 1);
      const gmath::SVector<long, 2> p2=R*gmath::SVector<long, 3>(static_cast<long>((x+w-1)/scale),
                                       static_cast<long>((y+h-1)/scale), 1);

      long xmin=std::min(p1[0], p2[0]), xmax=std::max(p1[0], p2[0]);
      long ymin=std::min(p1[1], p2[1]), ymax=std::max(p1[1], p2[1]);

      xmin=std::max(xmin, 0l);
      xmax=std::min(xmax, image->getWidth()-1);
      ymin=std::max(ymin, 0l);
      ymax=std::min(ymax, image->getHeight()-1);

      // search minimum and maximum valid intensity in the specified area

      imin=vmax;
      imax=vmin;

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        for (long y=ymin; y<=ymax; y++)
        {
          for (long x=xmin; x<=xmax; x++)
          {
            double v=image->get(x, y, d);

            if (v >= vmin && v <= vmax)
            {
              imin=std::min(imin, v);
              imax=std::max(imax, v);
            }
          }
        }
      }

      if (imax <= imin)
      {
        imin=0;
        imax=1;
      }
    }